

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

Color ColorFromNormalized(Vector4 normalized)

{
  return (Color)((int)(normalized.x * 255.0) & 0xffU |
                ((int)(normalized.y * 255.0) & 0xffU) << 8 |
                ((int)(normalized.z * 255.0) & 0xffU) << 0x10 | (int)(normalized.w * 255.0) << 0x18)
  ;
}

Assistant:

Color ColorFromNormalized(Vector4 normalized)
{
    Color result;

    result.r = (unsigned char)(normalized.x*255.0f);
    result.g = (unsigned char)(normalized.y*255.0f);
    result.b = (unsigned char)(normalized.z*255.0f);
    result.a = (unsigned char)(normalized.w*255.0f);

    return result;
}